

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

float fastpow2(float p)

{
  float fVar1;
  float local_1c;
  anon_union_4_2_947300a4 v;
  float z;
  int w;
  float clipp;
  float offset;
  float p_local;
  
  local_1c = p;
  if (p < -126.0) {
    local_1c = -126.0;
  }
  fVar1 = (local_1c - (float)(int)local_1c) + (float)(-(uint)(p < 0.0) & 0x3f800000);
  return (float)(long)((fVar1 * -1.4901291 + local_1c + 121.274055 + 27.728024 / (4.8425255 - fVar1)
                       ) * 8388608.0);
}

Assistant:

static inline float fastpow2(float p)
{
  float offset = (p < 0) ? 1.0f : 0.0f;
  float clipp = (p < -126) ? -126.0f : p;
  int w = (int)clipp;
  float z = clipp - w + offset;
  union {
    uint32_t i;
    float f;
  } v = {cast_uint32_t((1 << 23) * (clipp + 121.2740575f + 27.7280233f / (4.84252568f - z) - 1.49012907f * z))};

  return v.f;
}